

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PcacheDrop(PgHdr *p)

{
  i64 *piVar1;
  PCache *pPVar2;
  
  if ((p->flags & 2) != 0) {
    pcacheManageDirtyList(p,'\x01');
  }
  pPVar2 = p->pCache;
  piVar1 = &pPVar2->nRefSum;
  *piVar1 = *piVar1 + -1;
  (*sqlite3Config.pcache2.xUnpin)(pPVar2->pCache,p->pPage,1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheDrop(PgHdr *p){
  assert( p->nRef==1 );
  assert( sqlite3PcachePageSanity(p) );
  if( p->flags&PGHDR_DIRTY ){
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_REMOVE);
  }
  p->pCache->nRefSum--;
  sqlite3GlobalConfig.pcache2.xUnpin(p->pCache->pCache, p->pPage, 1);
}